

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O1

void __thiscall CheckBox::CheckBox(CheckBox *this)

{
  Vector2f local_30;
  
  (this->super_UIComponent).super_Drawable._vptr_Drawable = (_func_int **)&PTR__Drawable_001d19b0;
  sf::Transformable::Transformable(&(this->super_UIComponent).super_Transformable);
  (this->super_UIComponent).super_Transformable.field_0xa9 = 1;
  (this->super_UIComponent).super_Drawable._vptr_Drawable = (_func_int **)&PTR__CheckBox_001d2228;
  (this->super_UIComponent).super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__CheckBox_001d2260;
  sf::Text::Text(&this->text);
  local_30.x = 0.0;
  local_30.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->button,&local_30);
  local_30.x = 0.0;
  local_30.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->check,&local_30);
  sf::Color::Color(&this->checkColor);
  return;
}

Assistant:

CheckBox::CheckBox() {}